

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prmonutils.cpp
# Opt level: O2

bool prmon::kernel_proc_pid_test(pid_t pid)

{
  int iVar1;
  ostream *poVar2;
  stringstream pid_fname;
  stat stat_test;
  char *local_248 [4];
  stringstream local_228 [16];
  ostream local_218 [376];
  stat local_a0;
  
  std::__cxx11::stringstream::stringstream(local_228);
  poVar2 = std::operator<<(local_218,"/proc/");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,pid);
  poVar2 = std::operator<<(poVar2,"/task/");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,pid);
  poVar2 = std::operator<<(poVar2,"/children");
  std::ends<char,std::char_traits<char>>(poVar2);
  std::__cxx11::stringbuf::str();
  iVar1 = stat(local_248[0],&local_a0);
  std::__cxx11::string::~string((string *)local_248);
  std::__cxx11::stringstream::~stringstream(local_228);
  return iVar1 == 0;
}

Assistant:

bool kernel_proc_pid_test(const pid_t pid) {
  // Return true if the kernel has child PIDs
  // accessible via /proc
  std::stringstream pid_fname{};
  pid_fname << "/proc/" << pid << "/task/" << pid << "/children" << std::ends;
  struct stat stat_test;
  if (stat(pid_fname.str().c_str(), &stat_test)) return false;
  return true;
}